

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.h
# Opt level: O2

EditVertexTrait * MeshLib::trait<MeshLib::EditVertexTrait,MeshLib::Vertex>(Vertex *v)

{
  Trait *pTVar1;
  EditVertexTrait *pEVar2;
  undefined8 *puVar3;
  Trait **ppTVar4;
  
  ppTVar4 = &v->m_trait;
  do {
    pTVar1 = *ppTVar4;
    if (pTVar1 == (Trait *)0x0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = __assert_fail;
      __cxa_throw(puVar3,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pEVar2 = (EditVertexTrait *)__dynamic_cast(pTVar1,&Trait::typeinfo,&EditVertexTrait::typeinfo,0)
    ;
    ppTVar4 = &pTVar1->m_next;
  } while (pEVar2 == (EditVertexTrait *)0x0);
  return pEVar2;
}

Assistant:

T & trait( V * v )
{
	Trait * pt = v->trait();
	while( pt != NULL )
	{
		T *t = dynamic_cast<T*>(pt);
		if(t)
			return *t;
		//if( typeid(*pt) == typeid(T) )
		//	return *((T*)pt);
		pt = pt->next();
	}
	throw std::bad_cast();
	return *((T*)v->trait());
}